

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int codebook_decode_scalar_raw(vorb *f,Codebook *c)

{
  byte bVar1;
  uint uVar2;
  uint8 *puVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint32 *puVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  prep_huffman(f);
  if (c->codewords == (uint32 *)0x0) {
    puVar7 = c->sorted_codewords;
    if (puVar7 == (uint32 *)0x0) {
      return -1;
    }
  }
  else {
    uVar4 = c->entries;
    if (((int)uVar4 < 9) || (puVar7 = c->sorted_codewords, puVar7 == (uint32 *)0x0)) {
      if (c->sparse != '\0') {
        __assert_fail("!c->sparse",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                      ,0x691,"int codebook_decode_scalar_raw(vorb *, Codebook *)");
      }
      uVar9 = 0;
      uVar6 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar6 = uVar9;
      }
      do {
        if (uVar6 == uVar9) {
          f->error = VORBIS_invalid_stream;
LAB_0013f713:
          f->valid_bits = 0;
          return -1;
        }
        puVar3 = c->codeword_lengths;
        bVar1 = puVar3[uVar9];
        if ((bVar1 != 0xff) && (c->codewords[uVar9] == (~(-1 << (bVar1 & 0x1f)) & f->acc))) {
          if ((int)(uint)bVar1 <= f->valid_bits) {
            f->acc = f->acc >> (bVar1 & 0x1f);
            f->valid_bits = f->valid_bits - (uint)puVar3[uVar9];
            return (int)uVar9;
          }
          goto LAB_0013f713;
        }
        uVar9 = uVar9 + 1;
      } while( true );
    }
  }
  uVar2 = f->acc;
  uVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar4 = (uVar4 & 0xf0f0f0f) << 4 | uVar4 >> 4 & 0xf0f0f0f;
  uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333) * 4;
  uVar6 = 0;
  uVar11 = c->sorted_entries;
  while (uVar10 = uVar11, iVar5 = (int)uVar6, 1 < (int)uVar10) {
    uVar11 = uVar10 >> 1;
    if (puVar7[uVar11 + iVar5] <= (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555) * 2) {
      uVar6 = (ulong)(uVar11 + iVar5);
      uVar11 = uVar10 - uVar11;
    }
  }
  if (c->sparse == '\0') {
    iVar5 = c->sorted_values[uVar6];
  }
  bVar1 = c->codeword_lengths[iVar5];
  iVar8 = f->valid_bits - (uint)bVar1;
  if (f->valid_bits < (int)(uint)bVar1) {
    iVar5 = -1;
    iVar8 = 0;
  }
  else {
    f->acc = uVar2 >> (bVar1 & 0x1f);
  }
  f->valid_bits = iVar8;
  return iVar5;
}

Assistant:

static int codebook_decode_scalar_raw(vorb *f, Codebook *c)
{
   int i;
   prep_huffman(f);

   if (c->codewords == NULL && c->sorted_codewords == NULL)
      return -1;

   // cases to use binary search: sorted_codewords && !c->codewords
   //                             sorted_codewords && c->entries > 8
   if (c->entries > 8 ? c->sorted_codewords!=NULL : !c->codewords) {
      // binary search
      uint32 code = bit_reverse(f->acc);
      int x=0, n=c->sorted_entries, len;

      while (n > 1) {
         // invariant: sc[x] <= code < sc[x+n]
         int m = x + (n >> 1);
         if (c->sorted_codewords[m] <= code) {
            x = m;
            n -= (n>>1);
         } else {
            n >>= 1;
         }
      }
      // x is now the sorted index
      if (!c->sparse) x = c->sorted_values[x];
      // x is now sorted index if sparse, or symbol otherwise
      len = c->codeword_lengths[x];
      if (f->valid_bits >= len) {
         f->acc >>= len;
         f->valid_bits -= len;
         return x;
      }

      f->valid_bits = 0;
      return -1;
   }

   // if small, linear search
   assert(!c->sparse);
   for (i=0; i < c->entries; ++i) {
      if (c->codeword_lengths[i] == NO_CODE) continue;
      if (c->codewords[i] == (f->acc & ((1 << c->codeword_lengths[i])-1))) {
         if (f->valid_bits >= c->codeword_lengths[i]) {
            f->acc >>= c->codeword_lengths[i];
            f->valid_bits -= c->codeword_lengths[i];
            return i;
         }
         f->valid_bits = 0;
         return -1;
      }
   }

   error(f, VORBIS_invalid_stream);
   f->valid_bits = 0;
   return -1;
}